

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::clear(QToolBar *this)

{
  QList<QAction_*> *this_00;
  qsizetype qVar1;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<QAction_*> actions;
  qsizetype in_stack_ffffffffffffffb8;
  int local_2c;
  QList<QAction_*> local_20;
  QAction *action;
  
  action = *(QAction **)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::actions(in_RDI);
  local_2c = 0;
  while( true ) {
    this_00 = (QList<QAction_*> *)(long)local_2c;
    qVar1 = QList<QAction_*>::size(&local_20);
    if (qVar1 <= (long)this_00) break;
    QList<QAction_*>::at(this_00,in_stack_ffffffffffffffb8);
    QWidget::removeAction(in_RDI,action);
    local_2c = local_2c + 1;
  }
  QList<QAction_*>::~QList((QList<QAction_*> *)0x6ecb0f);
  if (*(QAction **)(in_FS_OFFSET + 0x28) == action) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBar::clear()
{
    QList<QAction *> actions = this->actions();
    for(int i = 0; i < actions.size(); i++)
        removeAction(actions.at(i));
}